

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O3

int __thiscall cbtQuantizedBvh::calcSplittingAxis(cbtQuantizedBvh *this,int startIndex,int endIndex)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  int nodeIndex;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  float fVar12;
  float fVar13;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [56];
  undefined1 auVar9 [64];
  float fVar15;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar21 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  cbtVector3 cVar27;
  cbtVector3 cVar28;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar3 = endIndex - startIndex;
  if (iVar3 != 0 && startIndex <= endIndex) {
    fVar22 = 0.0;
    fVar23 = 0.0;
    fVar24 = 0.0;
    fVar25 = 0.0;
    fVar26 = 0.0;
    nodeIndex = startIndex;
    do {
      auVar21 = in_ZMM1._8_56_;
      auVar14 = in_ZMM0._8_56_;
      cVar27 = getAabbMax(this,nodeIndex);
      auVar16._0_8_ = cVar27.m_floats._8_8_;
      auVar16._8_56_ = auVar21;
      auVar18._0_8_ = cVar27.m_floats._0_8_;
      auVar18._8_56_ = auVar14;
      cVar28 = getAabbMin(this,nodeIndex);
      auVar17._0_8_ = cVar28.m_floats._8_8_;
      auVar17._8_56_ = auVar21;
      auVar9._0_8_ = cVar28.m_floats._0_8_;
      auVar9._8_56_ = auVar14;
      nodeIndex = nodeIndex + 1;
      fVar26 = fVar26 + (cVar27.m_floats[0] + cVar28.m_floats[0]) * 0.5;
      auVar4 = vpermt2ps_avx512vl(auVar16._0_16_,_DAT_009e2040,auVar18._0_16_);
      auVar5 = vpermt2ps_avx512vl(auVar17._0_16_,_DAT_009e2040,auVar9._0_16_);
      in_ZMM1 = ZEXT1664(auVar5);
      fVar7 = (auVar4._0_4_ + auVar5._0_4_) * 0.5;
      fVar12 = (auVar4._4_4_ + auVar5._4_4_) * 0.5;
      fVar13 = (auVar4._8_4_ + auVar5._8_4_) * 0.5;
      fVar15 = (auVar4._12_4_ + auVar5._12_4_) * 0.5;
      in_ZMM0 = ZEXT1664(CONCAT412(fVar15,CONCAT48(fVar13,CONCAT44(fVar12,fVar7))));
      fVar22 = fVar22 + fVar7;
      fVar23 = fVar23 + fVar12;
      fVar24 = fVar24 + fVar13;
      fVar25 = fVar25 + fVar15;
    } while (endIndex != nodeIndex);
    if (startIndex < endIndex) {
      fVar7 = 0.0;
      fVar12 = 1.0 / (float)iVar3;
      auVar18 = ZEXT464((uint)(fVar12 * fVar26));
      auVar6._0_12_ = ZEXT812(0);
      auVar6._12_4_ = 0.0;
      auVar5._0_4_ = fVar12 * fVar22;
      auVar5._4_4_ = fVar12 * fVar23;
      auVar5._8_4_ = fVar12 * fVar24;
      auVar5._12_4_ = fVar12 * fVar25;
      auVar4 = auVar5;
      do {
        auVar21 = auVar18._8_56_;
        auVar14 = ZEXT856(auVar4._8_8_);
        cVar27 = getAabbMax(this,startIndex);
        auVar19._0_8_ = cVar27.m_floats._8_8_;
        auVar19._8_56_ = auVar21;
        auVar10._0_8_ = cVar27.m_floats._0_8_;
        auVar10._8_56_ = auVar14;
        cVar28 = getAabbMin(this,startIndex);
        auVar20._0_8_ = cVar28.m_floats._8_8_;
        auVar20._8_56_ = auVar21;
        auVar11._0_8_ = cVar28.m_floats._0_8_;
        auVar11._8_56_ = auVar14;
        local_48 = auVar6._0_4_;
        fStack_44 = auVar6._4_4_;
        fStack_40 = auVar6._8_4_;
        fStack_3c = auVar6._12_4_;
        startIndex = startIndex + 1;
        auVar4 = vpermt2ps_avx512vl(auVar19._0_16_,_DAT_009e2040,auVar10._0_16_);
        auVar6 = vpermt2ps_avx512vl(auVar20._0_16_,_DAT_009e2040,auVar11._0_16_);
        auVar18 = ZEXT1664(auVar6);
        auVar8._0_4_ = auVar4._0_4_ + auVar6._0_4_;
        auVar8._4_4_ = auVar4._4_4_ + auVar6._4_4_;
        auVar8._8_4_ = auVar4._8_4_ + auVar6._8_4_;
        auVar8._12_4_ = auVar4._12_4_ + auVar6._12_4_;
        auVar1._8_4_ = 0x3f000000;
        auVar1._0_8_ = 0x3f0000003f000000;
        auVar1._12_4_ = 0x3f000000;
        auVar4 = vmulps_avx512vl(auVar8,auVar1);
        fVar22 = (cVar27.m_floats[0] + cVar28.m_floats[0]) * 0.5 - fVar12 * fVar26;
        auVar6 = vsubps_avx(auVar4,auVar5);
        auVar4._0_4_ = auVar6._0_4_ * auVar6._0_4_;
        auVar4._4_4_ = auVar6._4_4_ * auVar6._4_4_;
        auVar4._8_4_ = auVar6._8_4_ * auVar6._8_4_;
        auVar4._12_4_ = auVar6._12_4_ * auVar6._12_4_;
        fVar7 = fVar7 + fVar22 * fVar22;
        auVar6._0_4_ = local_48 + auVar4._0_4_;
        auVar6._4_4_ = fStack_44 + auVar4._4_4_;
        auVar6._8_4_ = fStack_40 + auVar4._8_4_;
        auVar6._12_4_ = fStack_3c + auVar4._12_4_;
      } while (endIndex != startIndex);
      goto LAB_008a68c6;
    }
  }
  auVar6 = ZEXT816(0) << 0x40;
  fVar7 = 0.0;
LAB_008a68c6:
  fVar22 = 1.0 / ((float)iVar3 + -1.0);
  fVar26 = fVar22 * auVar6._0_4_;
  auVar5 = vmovshdup_avx(auVar6);
  auVar4 = vmaxss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)(fVar22 * fVar7)));
  uVar2 = 2;
  if (fVar22 * auVar5._0_4_ <= auVar4._0_4_) {
    uVar2 = (uint)(fVar22 * fVar7 < fVar26);
  }
  return uVar2;
}

Assistant:

int cbtQuantizedBvh::calcSplittingAxis(int startIndex, int endIndex)
{
	int i;

	cbtVector3 means(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
	cbtVector3 variance(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
	int numIndices = endIndex - startIndex;

	for (i = startIndex; i < endIndex; i++)
	{
		cbtVector3 center = cbtScalar(0.5) * (getAabbMax(i) + getAabbMin(i));
		means += center;
	}
	means *= (cbtScalar(1.) / (cbtScalar)numIndices);

	for (i = startIndex; i < endIndex; i++)
	{
		cbtVector3 center = cbtScalar(0.5) * (getAabbMax(i) + getAabbMin(i));
		cbtVector3 diff2 = center - means;
		diff2 = diff2 * diff2;
		variance += diff2;
	}
	variance *= (cbtScalar(1.) / ((cbtScalar)numIndices - 1));

	return variance.maxAxis();
}